

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall
google::protobuf::Map<std::__cxx11::string,CoreML::Specification::MILSpec::Function>::
insert<google::protobuf::Map<std::__cxx11::string,CoreML::Specification::MILSpec::Function>::const_iterator>
          (Map<std::__cxx11::string,CoreML::Specification::MILSpec::Function> *this,
          const_iterator first,const_iterator last)

{
  bool bVar1;
  const_pointer pvVar2;
  const_pointer key;
  Function *this_00;
  iterator local_58;
  undefined1 local_40 [8];
  iterator exist_it;
  const_iterator it;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function>
  *this_local;
  
  exist_it.it_.bucket_index_ = (size_type)first.it_.node_;
  while (bVar1 = protobuf::operator!=((const_iterator *)&exist_it.it_.bucket_index_,&last), bVar1) {
    pvVar2 = Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function>
             ::const_iterator::operator->((const_iterator *)&exist_it.it_.bucket_index_);
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function>
    ::find((iterator *)local_40,
           (Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function>
            *)this,&pvVar2->first);
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function>
    ::end(&local_58,
          (Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function>
           *)this);
    bVar1 = protobuf::operator==((iterator *)local_40,&local_58);
    if (bVar1) {
      pvVar2 = Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function>
               ::const_iterator::operator->((const_iterator *)&exist_it.it_.bucket_index_);
      key = Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function>
            ::const_iterator::operator->((const_iterator *)&exist_it.it_.bucket_index_);
      this_00 = Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function>
                ::operator[]((Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function>
                              *)this,&key->first);
      CoreML::Specification::MILSpec::Function::operator=(this_00,&pvVar2->second);
    }
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function>
    ::const_iterator::operator++((const_iterator *)&exist_it.it_.bucket_index_);
  }
  return;
}

Assistant:

void insert(InputIt first, InputIt last) {
    for (InputIt it = first; it != last; ++it) {
      iterator exist_it = find(it->first);
      if (exist_it == end()) {
        operator[](it->first) = it->second;
      }
    }
  }